

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*,_char_*,_short>
* __thiscall
fmt::v9::
make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,char*&,char*&,short&>
          (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_char_*,_char_*,_short>
           *__return_storage_ptr__,v9 *this,char **args,char **args_1,char **args_2,short *args_3)

{
  char *pcVar1;
  char *pcVar2;
  bool formattable_3;
  bool formattable_pointer_3;
  bool formattable_const_3;
  bool formattable_char_3;
  int *arg_3;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  char_type **arg_1;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_const_2;
  bool formattable_char_2;
  char_type **arg_2;
  longlong local_1e8;
  size_t local_1e0;
  size_t local_d0;
  size_t local_90;
  short *args_local_3;
  char **args_local_2;
  char **args_local_1;
  char **args_local;
  
  pcVar1 = *args;
  pcVar2 = *args_1;
  local_1e8._0_4_ = (int)*(short *)args_2;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = *(longlong *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_d0;
  (__return_storage_ptr__->data_).args_[1].field_0.string.data = pcVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_90;
  (__return_storage_ptr__->data_).args_[2].field_0.string.data = pcVar2;
  (__return_storage_ptr__->data_).args_[2].field_0.custom.format =
       (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v9::appender,_char>_ptr *)
       args_local_1;
  (__return_storage_ptr__->data_).args_[3].field_0.long_long_value = local_1e8;
  (__return_storage_ptr__->data_).args_[3].field_0.string.size = local_1e0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}